

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_disp_mgr.c
# Opt level: O1

void * ihevc_disp_mgr_get(disp_mgr_t *ps_disp_mgr,WORD32 *pi4_buf_id)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  WORD32 id;
  ulong uVar5;
  
  iVar3 = 0x7fffffff;
  uVar4 = 0xffffffff;
  uVar5 = 0;
  do {
    iVar1 = ps_disp_mgr->ai4_abs_poc[uVar5];
    if (iVar1 <= iVar3 && iVar1 != 0x7fffffff) {
      uVar4 = uVar5 & 0xffffffff;
      iVar3 = iVar1;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x40);
  iVar3 = (int)uVar4;
  *pi4_buf_id = iVar3;
  if (iVar3 == -1) {
    return (void *)0x0;
  }
  pvVar2 = ps_disp_mgr->apv_ptr[iVar3];
  ps_disp_mgr->apv_ptr[iVar3] = (void *)0x0;
  ps_disp_mgr->ai4_abs_poc[iVar3] = 0x7fffffff;
  return pvVar2;
}

Assistant:

void* ihevc_disp_mgr_get(
                disp_mgr_t *ps_disp_mgr,
                WORD32 *pi4_buf_id)
{
    WORD32 id;
    void *pv_ret_ptr;
    WORD32 i4_min_poc;
    WORD32 min_poc_id;


    pv_ret_ptr = NULL;
    i4_min_poc = 0x7FFFFFFF;
    min_poc_id = -1;

    /* Find minimum POC */
    for(id = 0; id < DISP_MGR_MAX_CNT; id++)
    {
        if((DEFAULT_POC != ps_disp_mgr->ai4_abs_poc[id]) &&
                        (ps_disp_mgr->ai4_abs_poc[id] <= i4_min_poc))
        {
            i4_min_poc = ps_disp_mgr->ai4_abs_poc[id];
            min_poc_id = id;
        }
    }
    *pi4_buf_id = min_poc_id;
    /* If all pocs are still default_poc then return NULL */
    if(-1 == min_poc_id)
    {
        return NULL;
    }

    pv_ret_ptr = ps_disp_mgr->apv_ptr[min_poc_id];

    /* Set abs poc to default and apv_ptr to null so that the buffer is not returned again */
    ps_disp_mgr->apv_ptr[min_poc_id] = NULL;
    ps_disp_mgr->ai4_abs_poc[min_poc_id] = DEFAULT_POC;
    return pv_ret_ptr;
}